

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<bool>::setCapacity(Vector<bool> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<bool> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<bool> newBuilder;
  size_t newSize_local;
  Vector<bool> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<bool>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<bool>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<bool>((ArrayBuilder<bool> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<bool>>(&this->builder);
  ArrayBuilder<bool>::addAll<kj::ArrayBuilder<bool>>((ArrayBuilder<bool> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<bool>>((ArrayBuilder<bool> *)local_38);
  ArrayBuilder<bool>::operator=(&this->builder,pAVar2);
  ArrayBuilder<bool>::~ArrayBuilder((ArrayBuilder<bool> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }